

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O1

_Bool react_to_slay(object *obj,monster_conflict *mon)

{
  _Bool _Var1;
  long lVar2;
  ulong uVar3;
  
  if (obj->slays == (_Bool *)0x0) {
    return false;
  }
  if (z_info->slay_max != '\0') {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if ((obj->slays[uVar3] == true) &&
         (_Var1 = react_to_specific_slay((slay_conflict *)((long)&slays->code + lVar2),mon), _Var1))
      {
        return true;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x38;
    } while (uVar3 < z_info->slay_max);
  }
  return false;
}

Assistant:

bool react_to_slay(struct object *obj, const struct monster *mon)
{
	int i;

	if (!obj->slays) return false;

	for (i = 0; i < z_info->slay_max; i++) {
		struct slay *s = &slays[i];
		if (obj->slays[i] && react_to_specific_slay(s, mon)) {
			return true;
		}
	}

	return false;
}